

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

Token __thiscall flow::lang::Lexer::parseRegExpGroup(Lexer *this)

{
  long *plVar1;
  int iVar2;
  
  nextChar(this,true);
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  this->numberValue_ = 0;
  iVar2 = this->currentChar_;
  if (iVar2 != -1) {
    do {
      plVar1 = (long *)(this->contexts_).
                       super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next;
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0) {
        return RegExpGroup;
      }
      if (9 < iVar2 - 0x30U) {
        return RegExpGroup;
      }
      this->numberValue_ = (ulong)(iVar2 - 0x30U) + this->numberValue_ * 10;
      std::__cxx11::string::push_back((char)this + -0x58);
      nextChar(this,true);
      iVar2 = this->currentChar_;
    } while (iVar2 != -1);
  }
  return RegExpGroup;
}

Assistant:

Token Lexer::parseRegExpGroup() {
  nextChar(); // skip leading '$'

  stringValue_.clear();
  numberValue_ = 0;

  while (!eof() && std::isdigit(currentChar())) {
    numberValue_ *= 10;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  return Token::RegExpGroup;
}